

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verCore.c
# Opt level: O0

void Ver_ParseRemoveSuffixTable(Ver_Man_t *pMan)

{
  int iVar1;
  char *local_28;
  char *pValue;
  char *pKey;
  st__generator *gen;
  Ver_Man_t *pMan_local;
  
  if (pMan->tName2Suffix != (st__table *)0x0) {
    gen = (st__generator *)pMan;
    pKey = (char *)st__init_gen(pMan->tName2Suffix);
    while (iVar1 = st__gen((st__generator *)pKey,&pValue,&local_28), iVar1 != 0) {
      if (pValue != (char *)0x0) {
        free(pValue);
        pValue = (char *)0x0;
      }
    }
    st__free_gen((st__generator *)pKey);
    st__free_table((st__table *)gen[2].entry);
    gen[2].entry = (st__table_entry *)0x0;
  }
  return;
}

Assistant:

void Ver_ParseRemoveSuffixTable( Ver_Man_t * pMan )
{
    st__generator * gen;
    char * pKey, * pValue;
    if ( pMan->tName2Suffix == NULL )
        return;
    st__foreach_item( pMan->tName2Suffix, gen, (const char **)&pKey, (char **)&pValue )
        ABC_FREE( pKey );
    st__free_table( pMan->tName2Suffix );
    pMan->tName2Suffix = NULL;
}